

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O3

void * If_ManDeriveGiaFromCells(void *pGia)

{
  ulong *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  Ifn_Ntk_t *p;
  Gia_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  Gia_Obj_t *pGVar10;
  Vec_Int_t *vLeaves;
  int *piVar11;
  Vec_Int_t *vCover;
  Gia_Obj_t *pGVar12;
  long lVar13;
  Gia_Man_t *pGVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  int local_50;
  
  if (*(long *)((long)pGia + 0x138) == 0) {
    __assert_fail("p->vConfigs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                  ,0x344,"void *If_ManDeriveGiaFromCells(void *)");
  }
  if (*(char **)((long)pGia + 0x140) == (char *)0x0) {
    __assert_fail("p->pCellStr != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                  ,0x345,"void *If_ManDeriveGiaFromCells(void *)");
  }
  if (*(long *)((long)pGia + 0x108) == 0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                  ,0x346,"void *If_ManDeriveGiaFromCells(void *)");
  }
  p = Ifn_NtkParse(*(char **)((long)pGia + 0x140));
  Ifn_Prepare(p,(word *)0x0,p->nInps);
  if (1 < *(int *)(*(long *)((long)pGia + 0x138) + 4)) {
    iVar7 = *(int *)(*(long *)(*(long *)((long)pGia + 0x138) + 8) + 4);
    p_00 = Gia_ManStart((*(int *)((long)pGia + 0x18) * 6) / 5 + 100);
    pcVar4 = *pGia;
    if (pcVar4 == (char *)0x0) {
      pcVar9 = (char *)0x0;
    }
    else {
      sVar8 = strlen(pcVar4);
      pcVar9 = (char *)malloc(sVar8 + 1);
      strcpy(pcVar9,pcVar4);
    }
    p_00->pName = pcVar9;
    pcVar4 = *(char **)((long)pGia + 8);
    if (pcVar4 == (char *)0x0) {
      pcVar9 = (char *)0x0;
    }
    else {
      sVar8 = strlen(pcVar4);
      pcVar9 = (char *)malloc(sVar8 + 1);
      strcpy(pcVar9,pcVar4);
    }
    p_00->pSpec = pcVar9;
    Gia_ManFillValue((Gia_Man_t *)pGia);
    *(undefined4 *)(*(long *)((long)pGia + 0x20) + 8) = 0;
    lVar18 = *(long *)((long)pGia + 0x40);
    if (0 < *(int *)(lVar18 + 4)) {
      lVar17 = 0;
      do {
        iVar6 = *(int *)(*(long *)(lVar18 + 8) + lVar17 * 4);
        if (((long)iVar6 < 0) || (*(int *)((long)pGia + 0x18) <= iVar6)) goto LAB_0043d815;
        lVar18 = *(long *)((long)pGia + 0x20);
        if (lVar18 == 0) break;
        pGVar10 = Gia_ManAppendObj(p_00);
        uVar15 = *(ulong *)pGVar10;
        *(ulong *)pGVar10 = uVar15 | 0x9fffffff;
        *(ulong *)pGVar10 =
             uVar15 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar12 = p_00->pObjs;
        if ((pGVar10 < pGVar12) || (pGVar12 + p_00->nObjs <= pGVar10)) goto LAB_0043d853;
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar12) >> 2) * -0x55555555);
        pGVar12 = p_00->pObjs;
        if ((pGVar10 < pGVar12) || (pGVar12 + p_00->nObjs <= pGVar10)) goto LAB_0043d853;
        *(int *)(lVar18 + 8 + (long)iVar6 * 0xc) =
             (int)((ulong)((long)pGVar10 - (long)pGVar12) >> 2) * 0x55555556;
        lVar17 = lVar17 + 1;
        lVar18 = *(long *)((long)pGia + 0x40);
      } while (lVar17 < *(int *)(lVar18 + 4));
    }
    vLeaves = (Vec_Int_t *)malloc(0x10);
    vLeaves->nCap = 0x10;
    piVar11 = (int *)malloc(0x40);
    vLeaves->pArray = piVar11;
    vCover = (Vec_Int_t *)malloc(0x10);
    vCover->nCap = 0x10000;
    vCover->nSize = 0;
    piVar11 = (int *)malloc(0x40000);
    vCover->pArray = piVar11;
    Gia_ManHashStart(p_00);
    uVar15 = (ulong)*(uint *)((long)pGia + 0x18);
    if ((int)*(uint *)((long)pGia + 0x18) < 1) {
      local_50 = 0;
    }
    else {
      lVar18 = 0;
      local_50 = 0;
      do {
        if (*(long *)((long)pGia + 0x20) == 0) break;
        puVar1 = (ulong *)(*(long *)((long)pGia + 0x20) + lVar18 * 0xc);
        uVar5 = *puVar1;
        uVar19 = (uint)uVar5;
        if ((uVar5 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar19) {
          if (((uVar19 & 0x1fffffff) == 0x1fffffff) ||
             ((uVar19 & 0x1fffffff) != ((uint)(uVar5 >> 0x20) & 0x1fffffff))) {
            lVar17 = *(long *)((long)pGia + 0x108);
            lVar13 = (long)*(int *)(lVar17 + 4);
            if (lVar13 <= lVar18) goto LAB_0043d834;
            if (*(int *)(*(long *)(lVar17 + 8) + lVar18 * 4) != 0) {
              vLeaves->nSize = 0;
              lVar20 = 0;
              while( true ) {
                lVar17 = *(long *)(lVar17 + 8);
                uVar19 = *(uint *)(lVar17 + lVar18 * 4);
                lVar16 = (long)(int)uVar19;
                if ((lVar16 < 0) || ((uint)lVar13 <= uVar19)) goto LAB_0043d834;
                if (*(int *)(lVar17 + lVar16 * 4) <= lVar20) break;
                iVar6 = *(int *)(lVar17 + lVar16 * 4 + 4 + lVar20 * 4);
                if (((long)iVar6 < 0) || (*(int *)((long)pGia + 0x18) <= iVar6)) goto LAB_0043d815;
                Vec_IntPush(vLeaves,*(int *)(*(long *)((long)pGia + 0x20) + 8 + (long)iVar6 * 0xc));
                lVar20 = lVar20 + 1;
                lVar17 = *(long *)((long)pGia + 0x108);
                lVar13 = (long)*(int *)(lVar17 + 4);
                if (lVar13 <= lVar18) goto LAB_0043d834;
              }
              iVar6 = local_50 * iVar7;
              if (iVar6 < -2) {
LAB_0043d891:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
              }
              uVar19 = iVar6 + 2;
              if (*(int *)(*(long *)((long)pGia + 0x138) + 4) <= (int)uVar19) goto LAB_0043d891;
              iVar6 = If_ManSatDeriveGiaFromBits
                                (p_00,p,(word *)((ulong)uVar19 * 4 +
                                                *(long *)(*(long *)((long)pGia + 0x138) + 8)),
                                 vLeaves,vCover);
              uVar15 = (ulong)*(int *)((long)pGia + 0x18);
              if ((long)uVar15 <= lVar18) goto LAB_0043d815;
              local_50 = local_50 + 1;
              *(int *)(*(long *)((long)pGia + 0x20) + 8 + lVar18 * 0xc) = iVar6;
            }
          }
          else {
            uVar3 = *(uint *)((long)puVar1 + (uVar5 & 0x1fffffff) * -0xc + 8);
            if ((int)uVar3 < 0) goto LAB_0043d872;
            pGVar12 = Gia_ManAppendObj(p_00);
            if (p_00->nObjs <= (int)(uVar3 >> 1)) {
              __assert_fail("iLit >= 0 && Abc_Lit2Var(iLit) < Gia_ManObjNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x30b,"int Gia_ManAppendBuf(Gia_Man_t *, int)");
            }
            pGVar10 = p_00->pObjs;
            if ((pGVar12 < pGVar10) || (pGVar10 + (uint)p_00->nObjs <= pGVar12)) {
LAB_0043d853:
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            uVar15 = (ulong)(((uint)((int)pGVar12 - (int)pGVar10) >> 2) * -0x55555555 - (uVar3 >> 1)
                            & 0x1fffffff);
            uVar19 = (uVar3 ^ uVar19 >> 0x1d) & 1;
            *(ulong *)pGVar12 =
                 (ulong)(uVar19 << 0x1d) |
                 (ulong)uVar19 << 0x3d | *(ulong *)pGVar12 & 0xc0000000c0000000 | uVar15 << 0x20 |
                 uVar15;
            p_00->nBufs = p_00->nBufs + 1;
            pGVar10 = p_00->pObjs;
            if ((pGVar12 < pGVar10) || (pGVar10 + p_00->nObjs <= pGVar12)) goto LAB_0043d853;
            *(int *)(puVar1 + 1) = (int)((ulong)((long)pGVar12 - (long)pGVar10) >> 2) * 0x55555556;
            uVar15 = (ulong)*(uint *)((long)pGia + 0x18);
          }
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 < (int)uVar15);
    }
    iVar6 = *(int *)(*(long *)((long)pGia + 0x138) + 4);
    if (0 < iVar6) {
      if (**(int **)(*(long *)((long)pGia + 0x138) + 8) != local_50) {
        __assert_fail("Vec_IntEntry(p->vConfigs, 0) == Count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                      ,0x36e,"void *If_ManDeriveGiaFromCells(void *)");
      }
      if (iVar6 != local_50 * iVar7 + 2) {
        __assert_fail("Vec_IntSize(p->vConfigs) == 2 + nConfigInts * Count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                      ,0x36f,"void *If_ManDeriveGiaFromCells(void *)");
      }
      lVar18 = *(long *)((long)pGia + 0x48);
      if (0 < *(int *)(lVar18 + 4)) {
        lVar17 = 0;
        do {
          iVar7 = *(int *)(*(long *)(lVar18 + 8) + lVar17 * 4);
          if (((long)iVar7 < 0) || (*(int *)((long)pGia + 0x18) <= iVar7)) {
LAB_0043d815:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if (*(long *)((long)pGia + 0x20) == 0) break;
          puVar2 = (undefined8 *)(*(long *)((long)pGia + 0x20) + (long)iVar7 * 0xc);
          uVar19 = *(uint *)((long)puVar2 + (ulong)((uint)*puVar2 & 0x1fffffff) * -0xc + 8);
          if ((int)uVar19 < 0) {
LAB_0043d872:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          iVar7 = Gia_ManAppendCo(p_00,(uint)*puVar2 >> 0x1d & 1 ^ uVar19);
          *(int *)(puVar2 + 1) = iVar7;
          lVar17 = lVar17 + 1;
          lVar18 = *(long *)((long)pGia + 0x48);
        } while (lVar17 < *(int *)(lVar18 + 4));
      }
      Gia_ManHashStop(p_00);
      Gia_ManSetRegNum(p_00,*(int *)((long)pGia + 0x10));
      if (vLeaves->pArray != (int *)0x0) {
        free(vLeaves->pArray);
      }
      free(vLeaves);
      if (vCover->pArray != (int *)0x0) {
        free(vCover->pArray);
      }
      free(vCover);
      free(p);
      pGVar14 = Gia_ManCleanup(p_00);
      Gia_ManStop(p_00);
      return pGVar14;
    }
  }
LAB_0043d834:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void * If_ManDeriveGiaFromCells( void * pGia )
{
    Gia_Man_t * p = (Gia_Man_t *)pGia;
    Gia_Man_t * pNew, * pTemp;
    Vec_Int_t * vCover, * vLeaves;
    Ifn_Ntk_t * pNtkCell;
    Gia_Obj_t * pObj; 
    word * pConfigData;
    //word * pTruth;
    int k, i, iLut, iVar;
    int nConfigInts, Count = 0;
    assert( p->vConfigs != NULL );
    assert( p->pCellStr != NULL );
    assert( Gia_ManHasMapping(p) );
    // derive cell network
    pNtkCell = Ifn_NtkParse( p->pCellStr );
    Ifn_Prepare( pNtkCell, NULL, pNtkCell->nInps );
    nConfigInts = Vec_IntEntry( p->vConfigs, 1 );
    // create new manager
    pNew = Gia_ManStart( 6*Gia_ManObjNum(p)/5 + 100 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // map primary inputs
    Gia_ManFillValue(p);
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    // iterate through nodes used in the mapping
    vLeaves = Vec_IntAlloc( 16 );
    vCover  = Vec_IntAlloc( 1 << 16 );
    Gia_ManHashStart( pNew );
    //Gia_ObjComputeTruthTableStart( p, Gia_ManLutSizeMax(p) );
    Gia_ManForEachAnd( p, pObj, iLut )
    {
        if ( Gia_ObjIsBuf(pObj) )
        {
            pObj->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
            continue;
        }
        if ( !Gia_ObjIsLut(p, iLut) )
            continue;
        // collect leaves
        //Vec_IntClear( vLeaves );
        //Gia_LutForEachFanin( p, iLut, iVar, k )
        //    Vec_IntPush( vLeaves, iVar );
        //pTruth = Gia_ObjComputeTruthTableCut( p, Gia_ManObj(p, iLut), vLeaves );
        // collect incoming literals
        Vec_IntClear( vLeaves );
        Gia_LutForEachFanin( p, iLut, iVar, k )
            Vec_IntPush( vLeaves, Gia_ManObj(p, iVar)->Value );
        pConfigData = (word *)Vec_IntEntryP( p->vConfigs, 2 + nConfigInts * Count++ );
        Gia_ManObj(p, iLut)->Value = If_ManSatDeriveGiaFromBits( pNew, pNtkCell, pConfigData, vLeaves, vCover );
    }
    assert( Vec_IntEntry(p->vConfigs, 0) == Count );
    assert( Vec_IntSize(p->vConfigs) == 2 + nConfigInts * Count );
    //Gia_ObjComputeTruthTableStop( p );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vCover );
    ABC_FREE( pNtkCell );
    // perform cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;

}